

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

bool __thiscall
absl::lts_20240722::flags_internal::FlagImpl::ParseFrom
          (FlagImpl *this,string_view value,FlagSettingMode set_mode,ValueSource source,string *err)

{
  FlagDefaultSrc src;
  byte bVar1;
  FlagDefaultSrc FVar2;
  string *err_00;
  bool bVar3;
  char *pcVar4;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> tentative_value;
  FlagDefaultSrc local_40;
  Mutex *local_38;
  
  err_00 = (string *)value._M_str;
  pcVar4 = (char *)value._M_len;
  local_38 = DataGuard(this);
  absl::lts_20240722::Mutex::Lock();
  if (set_mode == SET_FLAGS_DEFAULT) {
    value_02._M_str = pcVar4;
    value_02._M_len = (size_t)this;
    TryParse((FlagImpl *)&stack0xffffffffffffffb8,value_02,err_00);
    src = local_40;
    if (local_40.long_value == 0) {
LAB_00105be6:
      std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr
                ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)
                 &stack0xffffffffffffffb8);
      bVar3 = false;
      goto LAB_00105c1a;
    }
    bVar1 = this->field_0x29;
    if ((bVar1 & 3) == 0) {
      FVar2 = this->default_value_;
      (this->default_value_).dynamic_value = (void *)local_40;
    }
    else {
      (this->default_value_).dynamic_value = (void *)local_40;
      bVar1 = bVar1 & 0xfc;
      this->field_0x29 = bVar1;
      FVar2.long_value = 0;
    }
    local_40 = FVar2;
    if ((bVar1 & 4) == 0) {
      StoreValue(this,src.dynamic_value,source);
      this->field_0x29 = this->field_0x29 & 0xfb;
    }
  }
  else if (set_mode == SET_FLAG_IF_DEFAULT) {
    bVar3 = true;
    if ((this->field_0x29 & 4) != 0) goto LAB_00105c1a;
    value_01._M_str = pcVar4;
    value_01._M_len = (size_t)this;
    TryParse((FlagImpl *)&stack0xffffffffffffffb8,value_01,err_00);
    if (local_40.long_value == 0) goto LAB_00105be6;
    StoreValue(this,local_40.dynamic_value,source);
  }
  else {
    if (set_mode != SET_FLAGS_VALUE) {
      bVar3 = true;
      goto LAB_00105c1a;
    }
    value_00._M_str = pcVar4;
    value_00._M_len = (size_t)this;
    TryParse((FlagImpl *)&stack0xffffffffffffffb8,value_00,err_00);
    if (local_40.long_value == 0) goto LAB_00105be6;
    StoreValue(this,local_40.dynamic_value,source);
    if (source == kCommandLine) {
      this->field_0x29 = this->field_0x29 | 8;
    }
  }
  bVar3 = true;
  std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr
            ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)
             &stack0xffffffffffffffb8);
LAB_00105c1a:
  absl::lts_20240722::Mutex::Unlock();
  return bVar3;
}

Assistant:

bool FlagImpl::ParseFrom(absl::string_view value, FlagSettingMode set_mode,
                         ValueSource source, std::string& err) {
  absl::MutexLock l(DataGuard());

  switch (set_mode) {
    case SET_FLAGS_VALUE: {
      // set or modify the flag's value
      auto tentative_value = TryParse(value, err);
      if (!tentative_value) return false;

      StoreValue(tentative_value.get(), source);

      if (source == kCommandLine) {
        on_command_line_ = true;
      }
      break;
    }
    case SET_FLAG_IF_DEFAULT: {
      // set the flag's value, but only if it hasn't been set by someone else
      if (modified_) {
        // TODO(rogeeff): review and fix this semantic. Currently we do not fail
        // in this case if flag is modified. This is misleading since the flag's
        // value is not updated even though we return true.
        // *err = absl::StrCat(Name(), " is already set to ",
        //                     CurrentValue(), "\n");
        // return false;
        return true;
      }
      auto tentative_value = TryParse(value, err);
      if (!tentative_value) return false;

      StoreValue(tentative_value.get(), source);
      break;
    }
    case SET_FLAGS_DEFAULT: {
      auto tentative_value = TryParse(value, err);
      if (!tentative_value) return false;

      if (DefaultKind() == FlagDefaultKind::kDynamicValue) {
        void* old_value = default_value_.dynamic_value;
        default_value_.dynamic_value = tentative_value.release();
        tentative_value.reset(old_value);
      } else {
        default_value_.dynamic_value = tentative_value.release();
        def_kind_ = static_cast<uint8_t>(FlagDefaultKind::kDynamicValue);
      }

      if (!modified_) {
        // Need to set both default value *and* current, in this case.
        StoreValue(default_value_.dynamic_value, source);
        modified_ = false;
      }
      break;
    }
  }

  return true;
}